

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vec4f * __thiscall
Shader::vertex(vec4f *__return_storage_ptr__,Shader *this,Model *model,int iface,int nthvert)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  long lVar6;
  size_t i;
  size_t nthvert_00;
  bool bVar7;
  double ret_1;
  double dVar8;
  undefined4 uVar9;
  vec2f vVar10;
  vec<4UL,_double> ret;
  vec<4UL,_double> ret_2;
  vec<3UL,_double> ret_3;
  double local_178 [4];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_e0 [16];
  vec3f local_d0;
  mat<4UL,_4UL> local_b8;
  
  nthvert_00 = (size_t)nthvert;
  vVar10 = Model::uv(model,(long)iface,nthvert_00);
  if ((uint)nthvert < 3) {
    lVar4 = 0;
    if (nthvert != 0) {
      lVar4 = (ulong)(nthvert != 1) * 8 + 8;
    }
    *(double *)((long)&(this->varying_uv).rows[1].x + lVar4) = vVar10.y;
    *(double *)((long)&(this->varying_uv).rows[0].x + lVar4) = vVar10.x;
    operator*(&local_b8,&(this->super_IShader).uniform_Viewport,
              &(this->super_IShader).uniform_Projection);
    operator*((mat<4UL,_4UL> *)local_158,&local_b8,&(this->super_IShader).uniform_ModelView);
    Model::vert(&local_d0,model,(long)iface,nthvert_00);
    local_178[2] = 0.0;
    local_178[3] = 0.0;
    local_178[0] = 0.0;
    local_178[1] = 0.0;
    i = 3;
    do {
      dVar8 = 1.0;
      if (i + 1 < 4) {
        dVar8 = vec<3UL,_double>::operator[](&local_d0,i);
      }
      local_178[i] = dVar8;
      bVar7 = i != 0;
      i = i - 1;
    } while (bVar7);
    __return_storage_ptr__->data[2] = 0.0;
    __return_storage_ptr__->data[3] = 0.0;
    __return_storage_ptr__->data[0] = 0.0;
    __return_storage_ptr__->data[1] = 0.0;
    puVar5 = local_e0;
    lVar4 = 4;
    do {
      lVar3 = lVar4 + -1;
      dVar8 = 0.0;
      lVar6 = 0;
      do {
        dVar8 = dVar8 + *(double *)(puVar5 + lVar6 * 8) * *(double *)(local_158 + lVar6 * 8 + -8);
        lVar6 = lVar6 + -1;
      } while (lVar6 != -4);
      __return_storage_ptr__->data[lVar4 + -1] = dVar8;
      puVar5 = puVar5 + -0x20;
      lVar4 = lVar3;
    } while (lVar3 != 0);
    dVar8 = __return_storage_ptr__->data[3];
    uVar9 = (undefined4)((ulong)dVar8 >> 0x20);
    auVar1._8_4_ = SUB84(dVar8,0);
    auVar1._0_8_ = dVar8;
    auVar1._12_4_ = uVar9;
    local_148 = divpd(*(undefined1 (*) [16])(__return_storage_ptr__->data + 2),auVar1);
    auVar2._8_4_ = SUB84(dVar8,0);
    auVar2._0_8_ = dVar8;
    auVar2._12_4_ = uVar9;
    local_158 = divpd(*(undefined1 (*) [16])__return_storage_ptr__->data,auVar2);
    local_b8.rows[0].data[0] = 0.0;
    local_b8.rows[0].data[1] = 0.0;
    local_b8.rows[0].data[2] = 0.0;
    lVar4 = 3;
    do {
      lVar3 = (ulong)(lVar4 != 2) * 8 + 8;
      if (lVar4 == 1) {
        lVar3 = 0;
      }
      *(undefined8 *)((long)local_b8.rows[0].data + lVar3) =
           *(undefined8 *)(local_158 + lVar4 * 8 + -8);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    mat<3UL,_3UL>::set_col(&this->varying_tri,nthvert_00,(vec<3UL,_double> *)&local_b8);
    return __return_storage_ptr__;
  }
  __assert_fail("idx >= 0 && idx < ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0xbe,
                "void mat<2, 3>::set_col(const size_t, const vec<nrows, double> &) [nrows = 2, ncols = 3]"
               );
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        varying_uv.set_col(nthvert, model.uv(iface, nthvert));
        vec4f gl_Vertex = uniform_Viewport * uniform_Projection * uniform_ModelView *
                          embed<4>(model.vert(iface, nthvert));
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));
        return gl_Vertex;
    }